

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_perfect_hash(stb_perfect *p,uint x)

{
  uint uVar1;
  uint uVar2;
  uint local_30;
  uint local_2c;
  stb_uint av;
  stb_uint bv;
  stb_uint y;
  stb_uint m;
  uint x_local;
  stb_perfect *p_local;
  
  uVar1 = x * p->multiplicand;
  if (p->table == (stb_uint32 *)0x0) {
    p_local._4_4_ = 0xffffffff;
  }
  else {
    uVar2 = p->b_mask & (uVar1 >> 0x18) + (x >> 0x10);
    if (p->large_bmap == (stb_uint16 *)0x0) {
      local_2c = (uint)p->small_bmap[uVar2];
    }
    else {
      local_2c = (uint)p->large_bmap[uVar2];
    }
    local_2c = local_2c ^ p->table_mask & uVar1 + (x >> 0x10) >> 0xc;
    if (p->table[local_2c] == x) {
      local_30 = local_2c;
    }
    else {
      local_30 = 0xffffffff;
    }
    p_local._4_4_ = local_30;
  }
  return p_local._4_4_;
}

Assistant:

int stb_perfect_hash(stb_perfect *p, unsigned int x)
{
   stb_uint m = x * p->multiplicand;
   stb_uint y = x >> 16;
   stb_uint bv = (m >> 24) + y;
   stb_uint av = (m + y) >> 12;
   if (p->table == NULL) return -1;  // uninitialized table fails
   bv &= p->b_mask;
   av &= p->table_mask;
   if (p->large_bmap)
      av ^= p->large_bmap[bv];
   else
      av ^= p->small_bmap[bv];
   return p->table[av] == x ? av : -1;
}